

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgssvx.c
# Opt level: O1

void cgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,float *ferr,float *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  float fVar1;
  byte bVar2;
  trans_t tVar3;
  uint uVar4;
  int *piVar5;
  int_t iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float in_XMM0_Da;
  float fVar20;
  float fVar21;
  double dVar22;
  float in_XMM1_Da;
  SuperMatrix *local_e8;
  int local_d4;
  double local_d0;
  double *local_c8;
  long local_c0;
  int *local_b8;
  ulong local_b0;
  fact_t local_a4;
  float rowcnd;
  float colcnd;
  int info1;
  char norm [1];
  trans_t local_84;
  float amax;
  int_t *local_58;
  SuperMatrix AC;
  
  piVar5 = (int *)B->Store;
  local_c8 = (double *)X->Store;
  lVar12 = *(long *)(piVar5 + 2);
  lVar11 = *(long *)((long)local_c8 + 8);
  lVar9 = (long)*piVar5;
  local_c0 = (long)*(int *)local_c8;
  local_b0 = (ulong)(uint)B->ncol;
  *info = 0;
  tVar3 = options->Trans;
  bVar17 = tVar3 == NOTRANS;
  local_a4 = options->Fact;
  local_d0 = (double)CONCAT44(local_d0._4_4_,options->Equil);
  local_b8 = etree;
  if (local_a4 == FACTORED) {
    bVar18 = (*equed & 0xefU) == 0x42;
    bVar19 = (*equed & 0xfeU) == 0x42;
    in_XMM0_Da = smach("Safe minimum");
    in_XMM1_Da = 1.0 / in_XMM0_Da;
  }
  else {
    *equed = 'N';
    bVar18 = false;
    bVar19 = false;
  }
  iVar6 = -1;
  if (((options->Fact < 4) && (options->Trans < (CONJ|TRANS))) && (options->Equil < 2)) {
    iVar7 = A->nrow;
    iVar6 = -2;
    if ((((-1 < (long)iVar7) && (iVar7 == A->ncol)) &&
        (((A->Stype & ~SLU_NR) == SLU_NC && ((A->Dtype == SLU_C && (A->Mtype == SLU_GE)))))) &&
       ((options->Fact != FACTORED || (((bVar18 || (bVar19)) || (iVar6 = -6, *equed == 'N')))))) {
      if (bVar18) {
        fVar20 = 0.0;
        fVar21 = in_XMM1_Da;
        if (0 < iVar7) {
          lVar10 = 0;
          do {
            fVar1 = R[lVar10];
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
            if (fVar20 <= fVar1) {
              fVar20 = fVar1;
            }
            lVar10 = lVar10 + 1;
          } while (iVar7 != lVar10);
        }
        if (fVar21 <= 0.0) {
          *info = -7;
        }
        else if (iVar7 < 1) {
          rowcnd = 1.0;
        }
        else {
          if (fVar21 <= in_XMM0_Da) {
            fVar21 = in_XMM0_Da;
          }
          if (in_XMM1_Da <= fVar20) {
            fVar20 = in_XMM1_Da;
          }
          rowcnd = fVar21 / fVar20;
        }
      }
      if ((bVar19) && (*info == 0)) {
        iVar7 = A->nrow;
        fVar20 = 0.0;
        fVar21 = in_XMM1_Da;
        if (0 < (long)iVar7) {
          lVar10 = 0;
          do {
            fVar1 = C[lVar10];
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
            if (fVar20 <= fVar1) {
              fVar20 = fVar1;
            }
            lVar10 = lVar10 + 1;
          } while (iVar7 != lVar10);
        }
        if (fVar21 <= 0.0) {
          *info = -8;
        }
        else if (iVar7 < 1) {
          colcnd = 1.0;
        }
        else {
          if (fVar21 <= in_XMM0_Da) {
            fVar21 = in_XMM0_Da;
          }
          if (in_XMM1_Da <= fVar20) {
            fVar20 = in_XMM1_Da;
          }
          colcnd = fVar21 / fVar20;
        }
      }
      if (*info != 0) goto LAB_001031be;
      iVar6 = -0xc;
      if (lwork < -1) {
LAB_00103b37:
        *info = iVar6;
      }
      else {
        iVar6 = -0xd;
        if (B->ncol < 0) goto LAB_00103b37;
        if (B->ncol != 0) {
          iVar7 = 0;
          if (0 < A->nrow) {
            iVar7 = A->nrow;
          }
          if (((*piVar5 < iVar7) || (B->Stype != SLU_DN)) ||
             ((B->Dtype != SLU_C || (B->Mtype != SLU_GE)))) goto LAB_00103b37;
        }
      }
      iVar7 = X->ncol;
      iVar6 = -0xe;
      if (-1 < iVar7) {
        if (iVar7 == 0) goto LAB_001031be;
        iVar8 = 0;
        if (0 < A->nrow) {
          iVar8 = A->nrow;
        }
        if ((((iVar8 <= *(int *)local_c8) && (B->ncol == 0 || B->ncol == iVar7)) &&
            (X->Stype == SLU_DN)) && ((X->Dtype == SLU_C && (X->Mtype == SLU_GE))))
        goto LAB_001031be;
      }
    }
  }
  *info = iVar6;
LAB_001031be:
  if (*info == 0) {
    iVar7 = sp_ienv(1);
    iVar8 = sp_ienv(2);
    local_c8 = stat->utime;
    if (A->Stype == SLU_NR) {
      bVar17 = tVar3 != NOTRANS;
      local_84 = (trans_t)(tVar3 == NOTRANS);
      local_58 = (int_t *)A->Store;
      local_e8 = (SuperMatrix *)superlu_malloc(0x20);
      cCreate_CompCol_Matrix
                (local_e8,A->ncol,A->nrow,*local_58,*(singlecomplex **)(local_58 + 2),
                 *(int_t **)(local_58 + 4),*(int_t **)(local_58 + 6),SLU_NC,A->Dtype,A->Mtype);
    }
    else {
      local_84 = options->Trans;
      local_e8 = A;
    }
    if ((local_a4 != FACTORED) && (local_d0._0_4_ == 1)) {
      local_d0 = SuperLU_timer_();
      cgsequ(local_e8,R,C,&rowcnd,&colcnd,&amax,&info1);
      if (info1 == 0) {
        claqgs(local_e8,R,C,rowcnd,colcnd,amax,equed);
        bVar2 = *equed;
        bVar18 = (bVar2 & 0xef) == 0x42;
        bVar19 = true;
        if (bVar2 != 0x43) {
          bVar19 = bVar2 == 0x42;
        }
      }
      dVar22 = SuperLU_timer_();
      local_c8[4] = dVar22 - local_d0;
    }
    if (local_a4 != FACTORED) {
      local_d0 = SuperLU_timer_();
      if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(options->ColPerm,local_e8,perm_c);
      }
      dVar22 = SuperLU_timer_();
      *local_c8 = dVar22 - local_d0;
      local_d0 = SuperLU_timer_();
      sp_preorder(options,local_e8,perm_c,local_b8,&AC);
      dVar22 = SuperLU_timer_();
      local_c8[3] = dVar22 - local_d0;
      local_d0 = SuperLU_timer_();
      cgstrf(options,&AC,iVar8,iVar7,local_b8,work,lwork,perm_c,perm_r,L,U,Glu,stat,info);
      dVar22 = SuperLU_timer_();
      local_c8[7] = dVar22 - local_d0;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
    }
    iVar7 = *info;
    if (iVar7 < 1) {
      if (options->PivotGrowth != NO) {
        fVar20 = cPivotGrowth(A->ncol,local_e8,perm_c,L,U);
        *recip_pivot_growth = fVar20;
      }
      if (options->ConditionNumber != NO) {
        local_b8 = (int *)SuperLU_timer_();
        norm[0] = 'I';
        if (bVar17) {
          norm[0] = '1';
        }
        fVar20 = clangs(norm,local_e8);
        cgscon(norm,L,U,fVar20,rcond,stat,&info1);
        dVar22 = SuperLU_timer_();
        local_c8[0x10] = dVar22 - (double)local_b8;
      }
      if (0 < (int)local_b0) {
        if (bVar17) {
          if (bVar18) {
            uVar4 = A->nrow;
            lVar10 = lVar12 + 4;
            uVar13 = 0;
            do {
              if (0 < (int)uVar4) {
                uVar16 = 0;
                do {
                  *(float *)(lVar10 + -4 + uVar16 * 8) =
                       *(float *)(lVar10 + -4 + uVar16 * 8) * R[uVar16];
                  *(float *)(lVar10 + uVar16 * 8) = *(float *)(lVar10 + uVar16 * 8) * R[uVar16];
                  uVar16 = uVar16 + 1;
                } while (uVar4 != uVar16);
              }
              uVar13 = uVar13 + 1;
              lVar10 = lVar10 + lVar9 * 8;
            } while (uVar13 != local_b0);
          }
        }
        else if (bVar19) {
          uVar4 = A->nrow;
          lVar10 = lVar12 + 4;
          uVar13 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar16 = 0;
              do {
                *(float *)(lVar10 + -4 + uVar16 * 8) =
                     *(float *)(lVar10 + -4 + uVar16 * 8) * C[uVar16];
                *(float *)(lVar10 + uVar16 * 8) = *(float *)(lVar10 + uVar16 * 8) * C[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar4 != uVar16);
            }
            uVar13 = uVar13 + 1;
            lVar10 = lVar10 + lVar9 * 8;
          } while (uVar13 != local_b0);
        }
        uVar13 = 1;
        if (1 < (int)local_b0) {
          uVar13 = local_b0 & 0xffffffff;
        }
        local_c0 = local_c0 * 8;
        uVar16 = 0;
        lVar10 = lVar11;
        do {
          lVar14 = 0;
          if (0 < B->nrow) {
            lVar14 = 0;
            do {
              *(undefined8 *)(lVar10 + lVar14 * 8) = *(undefined8 *)(lVar12 + lVar14 * 8);
              lVar14 = lVar14 + 1;
            } while (lVar14 < B->nrow);
          }
          uVar16 = uVar16 + 1;
          lVar12 = lVar12 + lVar9 * 8;
          lVar10 = lVar10 + local_c0;
        } while (uVar16 != uVar13);
        local_d4 = (int)lVar14;
        local_b8 = (int *)SuperLU_timer_();
        cgstrs(local_84,L,U,perm_c,perm_r,X,stat,&info1);
        dVar22 = SuperLU_timer_();
        local_c8[0x11] = dVar22 - (double)local_b8;
        local_b8 = (int *)SuperLU_timer_();
        if (options->IterRefine == NOREFINE) {
          uVar13 = 1;
          if (1 < (int)local_b0) {
            uVar13 = local_b0 & 0xffffffff;
          }
          uVar16 = 0;
          do {
            berr[uVar16] = 1.0;
            ferr[uVar16] = 1.0;
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        else {
          cgsrfs(local_84,local_e8,L,U,perm_c,perm_r,equed,R,C,B,X,ferr,berr,stat,&info1);
        }
        dVar22 = SuperLU_timer_();
        local_c8[0x12] = dVar22 - (double)local_b8;
        if (bVar17) {
          if (bVar19) {
            uVar4 = A->nrow;
            uVar13 = 1;
            if (1 < (int)local_b0) {
              uVar13 = local_b0 & 0xffffffff;
            }
            lVar11 = lVar11 + 4;
            uVar16 = 0;
            do {
              uVar15 = 0;
              if (0 < (int)uVar4) {
                uVar15 = 0;
                do {
                  *(float *)(lVar11 + -4 + uVar15 * 8) =
                       *(float *)(lVar11 + -4 + uVar15 * 8) * C[uVar15];
                  *(float *)(lVar11 + uVar15 * 8) = *(float *)(lVar11 + uVar15 * 8) * C[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar4 != uVar15);
              }
              local_d4 = (int)uVar15;
              uVar16 = uVar16 + 1;
              lVar11 = lVar11 + local_c0;
            } while (uVar16 != uVar13);
          }
        }
        else if (bVar18) {
          uVar4 = A->nrow;
          uVar13 = 1;
          if (1 < (int)local_b0) {
            uVar13 = local_b0 & 0xffffffff;
          }
          lVar11 = lVar11 + 4;
          uVar16 = 0;
          do {
            uVar15 = 0;
            if (0 < (int)uVar4) {
              uVar15 = 0;
              do {
                *(float *)(lVar11 + -4 + uVar15 * 8) =
                     *(float *)(lVar11 + -4 + uVar15 * 8) * R[uVar15];
                *(float *)(lVar11 + uVar15 * 8) = *(float *)(lVar11 + uVar15 * 8) * R[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar4 != uVar15);
            }
            local_d4 = (int)uVar15;
            uVar16 = uVar16 + 1;
            lVar11 = lVar11 + local_c0;
          } while (uVar16 != uVar13);
        }
      }
      if ((options->ConditionNumber != NO) &&
         (fVar20 = *rcond, fVar21 = smach("E"), fVar20 < fVar21)) {
        *info = A->ncol + 1;
      }
      if (local_a4 != FACTORED) {
        cQuerySpace(L,U,mem_usage);
        Destroy_CompCol_Permuted(&AC);
      }
      if (A->Stype == SLU_NR) {
        Destroy_SuperMatrix_Store(local_e8);
        superlu_free(local_e8);
      }
    }
    else if (iVar7 <= A->ncol) {
      fVar20 = cPivotGrowth(iVar7,local_e8,perm_c,L,U);
      *recip_pivot_growth = fVar20;
    }
  }
  else {
    local_d4 = -*info;
    input_error("cgssvx",&local_d4);
  }
  return;
}

Assistant:

void
cgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, float *recip_pivot_growth, 
       float *rcond, float *ferr, float *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    singlecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern float clangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_C || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_C || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("cgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	cCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	cgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    claqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	cgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = cPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = cPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = clangs(norm, AA);
        cgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        cgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            cgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < slamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < smach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        cQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}